

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arg-val-math.c
# Opt level: O3

int rtosc_arg_val_sub(rtosc_arg_val_t *lhs,rtosc_arg_val_t *rhs,rtosc_arg_val_t *res)

{
  char cVar1;
  char cVar2;
  int iVar3;
  
  if (lhs->type != rhs->type) {
    cVar2 = lhs->type;
    cVar1 = rhs->type;
    if (cVar2 == cVar1) {
      res->type = cVar2;
      cVar2 = lhs->type;
      iVar3 = 0;
      switch(cVar2) {
      case 'c':
      case 'i':
        (res->val).i = (rhs->val).i + (lhs->val).i;
        break;
      case 'd':
        (res->val).d = (lhs->val).d + (rhs->val).d;
        break;
      case 'e':
      case 'g':
        goto switchD_00110298_caseD_65;
      case 'f':
        (res->val).f = (lhs->val).f + (rhs->val).f;
        break;
      case 'h':
        (res->val).s = (rhs->val).s + (long)(lhs->val).s;
        break;
      default:
        if ((cVar2 != 'F') && (cVar2 != 'T')) {
          return 0;
        }
        res->type = 'F';
        (res->val).T = '\0';
      }
    }
    else {
      if ((cVar1 != 'T' || cVar2 != 'F') && (cVar1 != 'F' || cVar2 != 'T')) {
        return 0;
      }
      res->type = 'T';
      (res->val).T = '\x01';
    }
    iVar3 = 1;
switchD_00110298_caseD_65:
    return iVar3;
  }
  res->type = lhs->type;
  cVar2 = lhs->type;
  iVar3 = 0;
  switch(cVar2) {
  case 'c':
  case 'i':
    (res->val).i = (lhs->val).i - (rhs->val).i;
    break;
  case 'd':
    (res->val).d = (lhs->val).d - (rhs->val).d;
    break;
  case 'e':
  case 'g':
    goto switchD_0011033d_caseD_65;
  case 'f':
    (res->val).f = (lhs->val).f - (rhs->val).f;
    break;
  case 'h':
    (res->val).s = (lhs->val).s + -(rhs->val).h;
    break;
  default:
    if ((cVar2 != 'F') && (cVar2 != 'T')) {
      return 0;
    }
    res->type = 'F';
    (res->val).T = '\0';
  }
  iVar3 = 1;
switchD_0011033d_caseD_65:
  return iVar3;
}

Assistant:

int rtosc_arg_val_sub(const rtosc_arg_val_t* lhs, const rtosc_arg_val_t* rhs,
                      rtosc_arg_val_t* res)
{
    if(lhs->type != rhs->type)
        return rtosc_arg_val_add(lhs, rhs, res);
    res->type = lhs->type;
    switch(lhs->type)
    {
        case 'd': res->val.d = lhs->val.d - rhs->val.d; return true;
        case 'f': res->val.f = lhs->val.f - rhs->val.f; return true;
        case 'h': res->val.h = lhs->val.h - rhs->val.h; return true;
        case 'c':
        case 'i': res->val.i = lhs->val.i - rhs->val.i; return true;
        case 'T':
        case 'F': res->type = 'F'; res->val.T = 0; return true;
        default: return false;
    }
}